

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadDataSection(BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t flags;
  Index num_data_segments;
  Address data_size;
  void *data;
  uint local_48;
  uint local_44;
  uint local_40;
  undefined4 uStack_3c;
  void *local_38;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x99])();
  if (iVar1 == 0) {
    RVar2 = ReadCount(this,&local_44,"data segment count");
    if (RVar2.enum_ != Error) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9a])(this->delegate_,(ulong)local_44);
      if (iVar1 == 0) {
        if (this->data_count_ == 0xffffffff || this->data_count_ == local_44) {
          if (local_44 != 0) {
            uVar5 = 0;
            do {
              RVar2 = ReadU32Leb128(this,&local_48,"data segment flags");
              if (RVar2.enum_ == Error) {
                return (Result)Error;
              }
              uVar4 = 0;
              if (local_48 != 0) {
                if ((this->options_->features).bulk_memory_enabled_ != true) {
                  pcVar3 = "invalid memory index %d: bulk memory not allowed";
LAB_00125a58:
                  PrintError(this,pcVar3);
                  return (Result)Error;
                }
                if (7 < local_48) {
                  pcVar3 = "invalid data segment flags: %#x";
                  goto LAB_00125a58;
                }
                if (((local_48 & 2) != 0) &&
                   (RVar2 = ReadU32Leb128(this,&local_40,"data segment memory index"),
                   uVar4 = local_40, RVar2.enum_ == Error)) {
                  return (Result)Error;
                }
              }
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9b])
                                (this->delegate_,uVar5,(ulong)uVar4);
              if (iVar1 != 0) {
                pcVar3 = "BeginDataSegment callback failed";
                goto LAB_00125811;
              }
              if ((local_48 & 1) == 0) {
                if ((this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    (this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  pcVar3 = "no memory to copy data to";
                  goto LAB_00125811;
                }
                iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9c])(this->delegate_,uVar5);
                if (iVar1 != 0) {
                  pcVar3 = "BeginDataSegmentInitExpr callback failed";
                  goto LAB_00125811;
                }
                RVar2 = ReadInstructions(this,true,this->read_end_,(Opcode *)0x0);
                if (RVar2.enum_ == Error) {
                  return (Result)Error;
                }
                iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9d])(this->delegate_,uVar5);
                if (iVar1 != 0) {
                  pcVar3 = "EndDataSegmentInitExpr callback failed";
                  goto LAB_00125811;
                }
              }
              RVar2 = ReadBytes(this,&local_38,(Address *)&local_40,"data segment data");
              if (RVar2.enum_ == Error) {
                return (Result)Error;
              }
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9e])
                                (this->delegate_,uVar5,local_38,CONCAT44(uStack_3c,local_40));
              if (iVar1 != 0) {
                pcVar3 = "OnDataSegmentData callback failed";
                goto LAB_00125811;
              }
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9f])(this->delegate_,uVar5);
              if (iVar1 != 0) {
                pcVar3 = "EndDataSegment callback failed";
                goto LAB_00125811;
              }
              uVar4 = (int)uVar5 + 1;
              uVar5 = (ulong)uVar4;
            } while (local_44 != uVar4);
          }
          iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa0])();
          if (iVar1 == 0) {
            return (Result)Ok;
          }
          pcVar3 = "EndDataSection callback failed";
        }
        else {
          pcVar3 = "data segment count does not equal count in DataCount section";
        }
      }
      else {
        pcVar3 = "OnDataSegmentCount callback failed";
      }
      PrintError(this,pcVar3);
    }
  }
  else {
    pcVar3 = "BeginDataSection callback failed";
LAB_00125811:
    PrintError(this,pcVar3);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadDataSection(Offset section_size) {
  CALLBACK(BeginDataSection, section_size);
  Index num_data_segments;
  CHECK_RESULT(ReadCount(&num_data_segments, "data segment count"));
  CALLBACK(OnDataSegmentCount, num_data_segments);
  // If the DataCount section is not present, then data_count_ will be invalid.
  ERROR_UNLESS(data_count_ == kInvalidIndex || data_count_ == num_data_segments,
               "data segment count does not equal count in DataCount section");
  for (Index i = 0; i < num_data_segments; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "data segment flags"));
    ERROR_IF(flags != 0 && !options_.features.bulk_memory_enabled(),
             "invalid memory index %d: bulk memory not allowed", flags);
    ERROR_IF(flags > SegFlagMax, "invalid data segment flags: %#x", flags);
    Index memory_index(0);
    if (flags & SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&memory_index, "data segment memory index"));
    }
    CALLBACK(BeginDataSegment, i, memory_index, flags);
    if (!(flags & SegPassive)) {
      ERROR_UNLESS(memories.size() > 0, "no memory to copy data to");
      CALLBACK(BeginDataSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndDataSegmentInitExpr, i);
    }

    Address data_size;
    const void* data;
    CHECK_RESULT(ReadBytes(&data, &data_size, "data segment data"));
    CALLBACK(OnDataSegmentData, i, data, data_size);
    CALLBACK(EndDataSegment, i);
  }
  CALLBACK0(EndDataSection);
  return Result::Ok;
}